

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::clara::detail::TokenStream::loadBuffer(TokenStream *this)

{
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  long lVar1;
  ulong uVar2;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined1 local_78 [8];
  string local_70;
  string opt;
  
  this_00 = &this->m_tokenBuffer;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::resize
            (this_00,0);
  pbVar3 = (this->it)._M_current;
  while( true ) {
    if (pbVar3 == (this->itEnd)._M_current) {
      return;
    }
    if (pbVar3->_M_string_length != 0) break;
    pbVar3 = pbVar3 + 1;
    (this->it)._M_current = pbVar3;
  }
  if (*(pbVar3->_M_dataplus)._M_p == '-') {
    lVar1 = ::std::__cxx11::string::find_first_of((char *)pbVar3,0x15db4e);
    if (lVar1 != -1) {
      local_78._0_4_ = Option;
      ::std::__cxx11::string::substr((ulong)(local_78 + 8),(ulong)pbVar3);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
      ::std::__cxx11::string::~string((string *)(local_78 + 8));
      this_01 = (string *)(local_78 + 8);
      local_78._0_4_ = Argument;
      ::std::__cxx11::string::substr((ulong)this_01,(ulong)pbVar3);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
      goto LAB_00132282;
    }
    if (((pbVar3->_M_dataplus)._M_p[1] != '-') && (2 < pbVar3->_M_string_length)) {
      ::std::__cxx11::string::string((string *)&opt,"- ",(allocator *)local_78);
      for (uVar2 = 1; uVar2 < pbVar3->_M_string_length; uVar2 = uVar2 + 1) {
        opt._M_dataplus._M_p[1] = (pbVar3->_M_dataplus)._M_p[uVar2];
        local_78._0_4_ = Option;
        ::std::__cxx11::string::string((string *)(local_78 + 8),(string *)&opt);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
        ::std::__cxx11::string::~string((string *)(local_78 + 8));
      }
      this_01 = &opt;
      goto LAB_00132282;
    }
    local_78._0_4_ = Option;
    ::std::__cxx11::string::string((string *)(local_78 + 8),(string *)pbVar3);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
    emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
  }
  else {
    local_78._0_4_ = Argument;
    ::std::__cxx11::string::string((string *)(local_78 + 8),(string *)pbVar3);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
    emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
  }
  this_01 = (string *)(local_78 + 8);
LAB_00132282:
  ::std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void loadBuffer() {
            m_tokenBuffer.resize( 0 );

            // Skip any empty strings
            while( it != itEnd && it->empty() )
                ++it;

            if( it != itEnd ) {
                auto const &next = *it;
                if( isOptPrefix( next[0] ) ) {
                    auto delimiterPos = next.find_first_of( " :=" );
                    if( delimiterPos != std::string::npos ) {
                        m_tokenBuffer.push_back( { TokenType::Option, next.substr( 0, delimiterPos ) } );
                        m_tokenBuffer.push_back( { TokenType::Argument, next.substr( delimiterPos + 1 ) } );
                    } else {
                        if( next[1] != '-' && next.size() > 2 ) {
                            std::string opt = "- ";
                            for( size_t i = 1; i < next.size(); ++i ) {
                                opt[1] = next[i];
                                m_tokenBuffer.push_back( { TokenType::Option, opt } );
                            }
                        } else {
                            m_tokenBuffer.push_back( { TokenType::Option, next } );
                        }
                    }
                } else {
                    m_tokenBuffer.push_back( { TokenType::Argument, next } );
                }
            }
        }